

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweightsemaphore.h
# Opt level: O2

__sighandler_t __thiscall
duckdb_moodycamel::LightweightSemaphore::signal
          (LightweightSemaphore *this,int __sig,__sighandler_t __handler)

{
  long lVar1;
  undefined4 in_register_00000034;
  __sighandler_t p_Var2;
  __sighandler_t p_Var3;
  
  p_Var2 = (__sighandler_t)CONCAT44(in_register_00000034,__sig);
  LOCK();
  lVar1 = (this->m_count).super___atomic_base<long>._M_i;
  (this->m_count).super___atomic_base<long>._M_i =
       (__int_type_conflict1)(p_Var2 + (this->m_count).super___atomic_base<long>._M_i);
  UNLOCK();
  p_Var3 = (__sighandler_t)-lVar1;
  if ((long)p_Var2 <= (long)p_Var3) {
    p_Var3 = p_Var2;
  }
  if (0 < (long)p_Var3) {
    p_Var3 = details::Semaphore::signal(&this->m_sema,(int)p_Var3,__handler);
    return p_Var3;
  }
  return p_Var2;
}

Assistant:

void signal(ssize_t count = 1)
	{
		assert(count >= 0);
		ssize_t oldCount = m_count.fetch_add(count, std::memory_order_release);
		ssize_t toRelease = -oldCount < count ? -oldCount : count;
		if (toRelease > 0)
		{
			m_sema.signal((int)toRelease);
		}
	}